

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O2

void PrintGraph(ExpressionGraphContext *ctx,ExprBase *expression,char *name)

{
  size_t sVar1;
  InplaceStr name_00;
  
  sVar1 = strlen(name);
  name_00.end = name + sVar1;
  name_00.begin = name;
  PrintGraph(ctx,expression,name_00);
  OutputContext::Flush(ctx->output);
  return;
}

Assistant:

void PrintGraph(ExpressionGraphContext &ctx, ExprBase *expression, const char *name)
{
	PrintGraph(ctx, expression, InplaceStr(name));

	ctx.output.Flush();
}